

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5UnicodeCategory(u32 iCode)

{
  uint uVar1;
  int iVar2;
  int iTest;
  u16 iKey;
  int ret;
  int iLo;
  int iHi;
  int iRes;
  u32 iCode_local;
  uint local_4;
  
  iRes = -1;
  if (iCode < 0x100000) {
    iLo = (int)aFts5UnicodeBlock[iCode >> 0x10];
    uVar1 = (uint)aFts5UnicodeBlock[(iCode >> 0x10) + 1];
    while (iHi = uVar1, iLo < iHi) {
      iVar2 = (iHi + iLo) / 2;
      uVar1 = iVar2;
      if ((uint)aFts5UnicodeMap[iVar2] <= (iCode & 0xffff)) {
        iLo = iVar2 + 1;
        uVar1 = iHi;
        iRes = iVar2;
      }
    }
    if (iRes < 0) {
      local_4 = 0;
    }
    else if ((iCode & 0xffff) <
             (uint)aFts5UnicodeMap[iRes] + ((int)(uint)aFts5UnicodeData[iRes] >> 5)) {
      local_4 = aFts5UnicodeData[iRes] & 0x1f;
      if ((local_4 == 0x1e) && (local_4 = 9, ((short)iCode - aFts5UnicodeMap[iRes] & 1) != 0)) {
        local_4 = 5;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int sqlite3Fts5UnicodeCategory(u32 iCode) {
  int iRes = -1;
  int iHi;
  int iLo;
  int ret;
  u16 iKey;

  if( iCode>=(1<<20) ){
    return 0;
  }
  iLo = aFts5UnicodeBlock[(iCode>>16)];
  iHi = aFts5UnicodeBlock[1+(iCode>>16)];
  iKey = (iCode & 0xFFFF);
  while( iHi>iLo ){
    int iTest = (iHi + iLo) / 2;
    assert( iTest>=iLo && iTest<iHi );
    if( iKey>=aFts5UnicodeMap[iTest] ){
      iRes = iTest;
      iLo = iTest+1;
    }else{
      iHi = iTest;
    }
  }

  if( iRes<0 ) return 0;
  if( iKey>=(aFts5UnicodeMap[iRes]+(aFts5UnicodeData[iRes]>>5)) ) return 0;
  ret = aFts5UnicodeData[iRes] & 0x1F;
  if( ret!=30 ) return ret;
  return ((iKey - aFts5UnicodeMap[iRes]) & 0x01) ? 5 : 9;
}